

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_str(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  TextOutputMethod *pp_Var2;
  Interpreter *pIVar3;
  TextOutputMethod p_Var4;
  undefined1 local_68 [8];
  long *local_60;
  Interpreter *local_58;
  bool local_50;
  anon_union_8_3_2f476f46_for_data local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  Value local_38 [2];
  
  local_50 = false;
  pIVar3 = (Interpreter *)operator_new(0x30);
  pIVar3->standardOutput = (TextOutputMethod)0x1;
  pIVar3->_vptr_Interpreter = (_func_int **)&PTR__StringStorage_001bf0d8;
  pIVar3->errorOutput = (TextOutputMethod)0x2;
  pIVar3->hostData = (void *)0xffffffffffffffff;
  p_Var4 = (TextOutputMethod)operator_new__(2);
  pIVar3->implicitOutput = p_Var4;
  *(undefined2 *)p_Var4 = 0x78;
  local_58 = pIVar3;
  Context::GetVar((Context *)local_68,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  Value::ToString((Value *)&local_48,(Machine *)local_68);
  local_38[0].type = String;
  local_38[0].noInvoke = false;
  local_38[0].localOnly = Off;
  local_38[0].data = local_48;
  if (local_48.ref == (RefCountedStorage *)0x0) {
    local_38[0].data = DAT_001c1308;
  }
  if (local_38[0].data.ref != (RefCountedStorage *)0x0) {
    (local_38[0].data.ref)->refCount = (local_38[0].data.ref)->refCount + 1;
  }
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   local_38);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_38[0].type) && (local_38[0].data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_38[0].data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_38[0].data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_38[0].data.number = 0.0;
  }
  if ((local_48.ref != (RefCountedStorage *)0x0) && ((bool)local_40.tempNum._0_1_ == false)) {
    plVar1 = &(local_48.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_48.ref)->_vptr_RefCountedStorage[1])();
    }
    local_48.number = 0.0;
  }
  if ((2 < local_68[0]) && (local_60 != (long *)0x0)) {
    plVar1 = local_60 + 1;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
  }
  if ((local_58 != (Interpreter *)0x0) && (local_50 == false)) {
    pp_Var2 = &local_58->standardOutput;
    *pp_Var2 = *pp_Var2 + -1;
    if (*pp_Var2 == (TextOutputMethod)0x0) {
      (*local_58->_vptr_Interpreter[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_str(Context *context, IntrinsicResult partialResult) {
		return IntrinsicResult(context->GetVar("x").ToString());
	}